

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::SpectrumCheckerboardTexture::Evaluate
          (SpectrumCheckerboardTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  TextureEvalContext ctx_02;
  TextureEvalContext ctx_03;
  SampledWavelengths lambda_00;
  SampledWavelengths lambda_01;
  SampledWavelengths lambda_02;
  SampledWavelengths lambda_03;
  TextureEvalContext ctx_04;
  array<float,_4> aVar1;
  float *pfVar2;
  undefined8 in_RDI;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  undefined1 auVar14 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  ulong uVar25;
  undefined1 auVar24 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  SampledSpectrum SVar26;
  undefined1 in_stack_00000008 [64];
  array<float,_2> wt;
  TextureMapping3DHandle *in_stack_fffffffffffffcf8;
  SampledSpectrum *pSVar27;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 uVar28;
  undefined4 in_stack_fffffffffffffd04;
  Float FVar29;
  SampledSpectrum *this_00;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  float fVar30;
  undefined8 in_stack_fffffffffffffd60;
  array<float,_2> *this_01;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined8 *puVar31;
  undefined1 (*pauVar32) [64];
  TextureMapping3DHandle *in_stack_ffffffffffffff48;
  TextureMapping2DHandle *in_stack_ffffffffffffff50;
  AAMethod in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 auVar33 [12];
  undefined1 in_stack_ffffffffffffff88 [16];
  undefined1 auVar34 [24];
  undefined1 auStack_50 [40];
  array<float,_2> local_20 [2];
  undefined8 local_10;
  undefined8 local_8;
  
  puVar31 = (undefined8 *)&stack0x00000048;
  pauVar32 = &&stack0x00000008;
  auVar3 = vmovdqu64_avx512f(in_stack_00000008);
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar34 = auVar3._0_24_;
  auStack_50 = auVar3._24_40_;
  TextureMapping2DHandle::TextureMapping2DHandle
            ((TextureMapping2DHandle *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)
             ,(TextureMapping2DHandle *)in_stack_fffffffffffffcf8);
  TextureMapping3DHandle::TextureMapping3DHandle
            ((TextureMapping3DHandle *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)
             ,in_stack_fffffffffffffcf8);
  auVar3._24_40_ = auStack_50;
  auVar3._0_24_ = auVar34;
  auVar3 = vmovdqu64_avx512f(auVar3);
  vmovdqu64_avx512f(auVar3);
  ctx_04.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_ffffffffffffff78;
  ctx_04.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  ctx_04.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_ffffffffffffff70;
  ctx_04.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  ctx_04.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_ffffffffffffff80;
  ctx_04.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  auVar33 = in_stack_ffffffffffffff88._0_12_;
  ctx_04.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar33._0_4_;
  ctx_04.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar33._4_4_;
  ctx_04.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar33._8_4_;
  ctx_04.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)in_stack_ffffffffffffff88._12_4_;
  ctx_04.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)auVar34._0_4_;
  ctx_04.dudx = (Float)auVar34._4_4_;
  ctx_04.dudy = (Float)auVar34._8_4_;
  ctx_04.dvdx = (Float)auVar34._12_4_;
  ctx_04.dvdy = (Float)auVar34._16_4_;
  ctx_04.faceIndex = auVar34._20_4_;
  auVar4._0_8_ = Checkerboard(in_stack_ffffffffffffff5c,ctx_04,in_stack_ffffffffffffff50,
                              in_stack_ffffffffffffff48);
  auVar4._8_56_ = extraout_var;
  local_20[0].values = (float  [2])vmovlpd_avx(auVar4._0_16_);
  pfVar2 = pstd::array<float,_2>::operator[](local_20,0);
  uVar25 = 0;
  if ((*pfVar2 != 0.0) || (NAN(*pfVar2))) {
    pfVar2 = pstd::array<float,_2>::operator[](local_20,1);
    uVar25 = 0;
    if ((*pfVar2 != 0.0) || (NAN(*pfVar2))) {
      this_01 = local_20;
      pfVar2 = pstd::array<float,_2>::operator[](this_01,0);
      fVar30 = *pfVar2;
      auVar3 = vmovdqu64_avx512f(*pauVar32);
      auVar3 = vmovdqu64_avx512f(auVar3);
      auVar4 = vmovdqu64_avx512f(auVar3);
      auVar3 = vmovdqu64_avx512f(auVar4);
      pSVar27 = auVar3._0_8_;
      FVar29 = auVar3._12_4_;
      auVar14 = ZEXT856(auVar4._8_8_);
      auVar24 = ZEXT856(uVar25);
      ctx_02._8_8_ = *puVar31;
      ctx_02.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)auVar3._56_8_;
      ctx_02.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)auVar3._56_8_ >> 0x20);
      ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = puVar31[1];
      ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar31[2];
      ctx_02._32_8_ = puVar31[3];
      ctx_02.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)in_stack_fffffffffffffd58;
      ctx_02.dudx = fVar30;
      ctx_02._48_8_ = this_01;
      ctx_02.dvdy = (Float)in_stack_fffffffffffffd68;
      ctx_02.faceIndex = in_stack_fffffffffffffd6c;
      lambda_02.lambda.values[1] = (float)in_stack_fffffffffffffd74;
      lambda_02.lambda.values[0] = (float)in_stack_fffffffffffffd70;
      lambda_02.lambda.values._8_8_ = puVar31;
      lambda_02.pdf.values._0_8_ = pauVar32;
      lambda_02.pdf.values[2] = (float)(int)in_RDI;
      lambda_02.pdf.values[3] = (float)(int)((ulong)in_RDI >> 0x20);
      SVar26 = SpectrumTextureHandle::Evaluate(auVar3._24_8_,ctx_02,lambda_02);
      auVar19._0_8_ = SVar26.values.values._8_8_;
      auVar19._8_56_ = auVar24;
      auVar9._0_8_ = SVar26.values.values._0_8_;
      auVar9._8_56_ = auVar14;
      auVar14 = (undefined1  [56])0x0;
      vmovlpd_avx(auVar9._0_16_);
      vmovlpd_avx(auVar19._0_16_);
      SVar26 = pbrt::operator*(FVar29,pSVar27);
      auVar20._0_8_ = SVar26.values.values._8_8_;
      auVar20._8_56_ = auVar24;
      uVar25 = auVar24._8_8_;
      auVar10._0_8_ = SVar26.values.values._0_8_;
      auVar10._8_56_ = auVar14;
      vmovlpd_avx(auVar10._0_16_);
      vmovlpd_avx(auVar20._0_16_);
      pfVar2 = pstd::array<float,_2>::operator[](this_01,1);
      auVar3 = vmovdqu64_avx512f(*pauVar32);
      auVar3 = vmovdqu64_avx512f(auVar3);
      auVar4 = vmovdqu64_avx512f(auVar3);
      auVar3 = vmovdqu64_avx512f(auVar4);
      pSVar27 = auVar3._0_8_;
      uVar28 = auVar3._8_4_;
      FVar29 = auVar3._12_4_;
      this_00 = auVar3._16_8_;
      auVar14 = ZEXT856(auVar4._8_8_);
      auVar24 = ZEXT856(uVar25);
      ctx_03._8_8_ = *puVar31;
      ctx_03.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)auVar3._56_8_;
      ctx_03.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)auVar3._56_8_ >> 0x20);
      ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = puVar31[1];
      ctx_03.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar31[2];
      ctx_03._32_8_ = puVar31[3];
      ctx_03.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)in_stack_fffffffffffffd58;
      ctx_03.dudx = fVar30;
      ctx_03._48_8_ = this_01;
      ctx_03.dvdy = (Float)in_stack_fffffffffffffd68;
      ctx_03.faceIndex = (int)*pfVar2;
      lambda_03.lambda.values[1] = (float)in_stack_fffffffffffffd74;
      lambda_03.lambda.values[0] = (float)in_stack_fffffffffffffd70;
      lambda_03.lambda.values._8_8_ = puVar31;
      lambda_03.pdf.values._0_8_ = pauVar32;
      lambda_03.pdf.values[2] = (float)(int)in_RDI;
      lambda_03.pdf.values[3] = (float)(int)((ulong)in_RDI >> 0x20);
      SVar26 = SpectrumTextureHandle::Evaluate(auVar3._24_8_,ctx_03,lambda_03);
      auVar21._0_8_ = SVar26.values.values._8_8_;
      auVar21._8_56_ = auVar24;
      auVar11._0_8_ = SVar26.values.values._0_8_;
      auVar11._8_56_ = auVar14;
      auVar14 = (undefined1  [56])0x0;
      vmovlpd_avx(auVar11._0_16_);
      vmovlpd_avx(auVar21._0_16_);
      SVar26 = pbrt::operator*(FVar29,pSVar27);
      auVar22._0_8_ = SVar26.values.values._8_8_;
      auVar22._8_56_ = auVar24;
      auVar12._0_8_ = SVar26.values.values._0_8_;
      auVar12._8_56_ = auVar14;
      vmovlpd_avx(auVar12._0_16_);
      vmovlpd_avx(auVar22._0_16_);
      SVar26 = SampledSpectrum::operator+(this_00,(SampledSpectrum *)CONCAT44(FVar29,uVar28));
      auVar23._0_8_ = SVar26.values.values._8_8_;
      auVar23._8_56_ = auVar24;
      auVar13._0_8_ = SVar26.values.values._0_8_;
      auVar13._8_56_ = auVar14;
      local_10 = vmovlpd_avx(auVar13._0_16_);
      local_8 = vmovlpd_avx(auVar23._0_16_);
    }
    else {
      pfVar2 = pstd::array<float,_2>::operator[](local_20,0);
      auVar3 = vmovdqu64_avx512f(*pauVar32);
      auVar3 = vmovdqu64_avx512f(auVar3);
      auVar4 = vmovdqu64_avx512f(auVar3);
      auVar3 = vmovdqu64_avx512f(auVar4);
      pSVar27 = auVar3._0_8_;
      FVar29 = auVar3._12_4_;
      auVar14 = ZEXT856(auVar4._8_8_);
      auVar24 = ZEXT856(uVar25);
      ctx_01._8_8_ = *puVar31;
      ctx_01.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)auVar3._56_8_;
      ctx_01.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)auVar3._56_8_ >> 0x20);
      ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = puVar31[1];
      ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar31[2];
      ctx_01._32_8_ = puVar31[3];
      ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)in_stack_fffffffffffffd58;
      ctx_01.dudx = (Float)in_stack_fffffffffffffd5c;
      ctx_01.dudy = (Float)(int)in_stack_fffffffffffffd60;
      ctx_01.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
      ctx_01.dvdy = (Float)in_stack_fffffffffffffd68;
      ctx_01.faceIndex = in_stack_fffffffffffffd6c;
      lambda_01.lambda.values[1] = (float)in_stack_fffffffffffffd74;
      lambda_01.lambda.values[0] = *pfVar2;
      lambda_01.lambda.values._8_8_ = puVar31;
      lambda_01.pdf.values._0_8_ = pauVar32;
      lambda_01.pdf.values[2] = (float)(int)in_RDI;
      lambda_01.pdf.values[3] = (float)(int)((ulong)in_RDI >> 0x20);
      SVar26 = SpectrumTextureHandle::Evaluate(auVar3._24_8_,ctx_01,lambda_01);
      auVar17._0_8_ = SVar26.values.values._8_8_;
      auVar17._8_56_ = auVar24;
      auVar7._0_8_ = SVar26.values.values._0_8_;
      auVar7._8_56_ = auVar14;
      auVar14 = (undefined1  [56])0x0;
      vmovlpd_avx(auVar7._0_16_);
      vmovlpd_avx(auVar17._0_16_);
      SVar26 = pbrt::operator*(FVar29,pSVar27);
      auVar18._0_8_ = SVar26.values.values._8_8_;
      auVar18._8_56_ = auVar24;
      auVar8._0_8_ = SVar26.values.values._0_8_;
      auVar8._8_56_ = auVar14;
      local_10 = vmovlpd_avx(auVar8._0_16_);
      local_8 = vmovlpd_avx(auVar18._0_16_);
    }
  }
  else {
    pfVar2 = pstd::array<float,_2>::operator[](local_20,1);
    auVar3 = vmovdqu64_avx512f(*pauVar32);
    auVar3 = vmovdqu64_avx512f(auVar3);
    auVar4 = vmovdqu64_avx512f(auVar3);
    auVar3 = vmovdqu64_avx512f(auVar4);
    pSVar27 = auVar3._0_8_;
    FVar29 = auVar3._12_4_;
    auVar14 = ZEXT856(auVar4._8_8_);
    auVar24 = ZEXT856(uVar25);
    ctx_00._8_8_ = *puVar31;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)auVar3._56_8_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)auVar3._56_8_ >> 0x20);
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = puVar31[1];
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar31[2];
    ctx_00._32_8_ = puVar31[3];
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)in_stack_fffffffffffffd58;
    ctx_00.dudx = (Float)in_stack_fffffffffffffd5c;
    ctx_00.dudy = (Float)(int)in_stack_fffffffffffffd60;
    ctx_00.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
    ctx_00.dvdy = (Float)in_stack_fffffffffffffd68;
    ctx_00.faceIndex = in_stack_fffffffffffffd6c;
    lambda_00.lambda.values[1] = *pfVar2;
    lambda_00.lambda.values[0] = (float)in_stack_fffffffffffffd70;
    lambda_00.lambda.values._8_8_ = puVar31;
    lambda_00.pdf.values._0_8_ = pauVar32;
    lambda_00.pdf.values[2] = (float)(int)in_RDI;
    lambda_00.pdf.values[3] = (float)(int)((ulong)in_RDI >> 0x20);
    SVar26 = SpectrumTextureHandle::Evaluate(auVar3._24_8_,ctx_00,lambda_00);
    auVar15._0_8_ = SVar26.values.values._8_8_;
    auVar15._8_56_ = auVar24;
    auVar5._0_8_ = SVar26.values.values._0_8_;
    auVar5._8_56_ = auVar14;
    auVar14 = (undefined1  [56])0x0;
    vmovlpd_avx(auVar5._0_16_);
    vmovlpd_avx(auVar15._0_16_);
    SVar26 = pbrt::operator*(FVar29,pSVar27);
    auVar16._0_8_ = SVar26.values.values._8_8_;
    auVar16._8_56_ = auVar24;
    auVar6._0_8_ = SVar26.values.values._0_8_;
    auVar6._8_56_ = auVar14;
    local_10 = vmovlpd_avx(auVar6._0_16_);
    local_8 = vmovlpd_avx(auVar16._0_16_);
  }
  aVar1.values[2] = (float)(undefined4)local_8;
  aVar1.values[3] = (float)local_8._4_4_;
  aVar1.values[0] = (float)(undefined4)local_10;
  aVar1.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        pstd::array<Float, 2> wt = Checkerboard(aaMethod, ctx, map2D, map3D);
        if (wt[0] == 0)
            return wt[1] * tex[1].Evaluate(ctx, lambda);
        else if (wt[1] == 0)
            return wt[0] * tex[0].Evaluate(ctx, lambda);
        else
            return wt[0] * tex[0].Evaluate(ctx, lambda) +
                   wt[1] * tex[1].Evaluate(ctx, lambda);
    }